

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

void __thiscall
cbtGImpactCompoundShape::calculateLocalInertia
          (cbtGImpactCompoundShape *this,cbtScalar mass,cbtVector3 *inertia)

{
  cbtCollisionShape *pcVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  cbtTransform *transform;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [56];
  cbtVector3 cVar12;
  cbtVector3 temp_inertia;
  cbtVector3 local_38;
  undefined1 auVar9 [56];
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  iVar3 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0x16])(this);
  auVar10 = ZEXT464((uint)mass);
  lVar5 = (long)iVar3;
  lVar6 = lVar5 << 6;
  while( true ) {
    auVar11 = auVar10._8_56_;
    lVar6 = lVar6 + -0x40;
    bVar7 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar7) break;
    auVar9 = (undefined1  [56])0x0;
    pcVar1 = (this->m_childShapes).m_data[lVar5];
    (*pcVar1->_vptr_cbtCollisionShape[8])((ulong)(uint)(mass / (float)iVar3),pcVar1,&local_38);
    iVar4 = (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x17])(this);
    if ((char)iVar4 == '\0') {
      transform = cbtTransform::getIdentity();
    }
    else {
      transform = (cbtTransform *)(*(long *)&this->field_0xd8 + lVar6);
    }
    cVar12 = gim_inertia_add_transformed(inertia,&local_38,transform);
    auVar10._0_8_ = cVar12.m_floats._8_8_;
    auVar10._8_56_ = auVar11;
    auVar8._0_8_ = cVar12.m_floats._0_8_;
    auVar8._8_56_ = auVar9;
    auVar2 = vmovlhps_avx(auVar8._0_16_,auVar10._0_16_);
    *(undefined1 (*) [16])inertia->m_floats = auVar2;
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactCompoundShape::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();
#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getNumChildShapes();
	cbtScalar shapemass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 temp_inertia;
		m_childShapes[i]->calculateLocalInertia(shapemass, temp_inertia);
		if (childrenHasTransform())
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, m_childTransforms[i]);
		}
		else
		{
			inertia = gim_inertia_add_transformed(inertia, temp_inertia, cbtTransform::getIdentity());
		}
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif
	unlockChildShapes();
}